

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O0

int compare_zip(char **zn)

{
  int iVar1;
  code *check;
  zip_t *local_a8;
  zip_uint64_t j;
  int res;
  int i;
  zip_uint64_t n [2];
  entry *e [2];
  archive a [2];
  char **zn_local;
  
  for (j._4_4_ = 0; j._4_4_ < 2; j._4_4_ = j._4_4_ + 1) {
    a[(long)j._4_4_ + -1].comment_length = (size_t)zn[j._4_4_];
    a[j._4_4_].nentry = 0;
    a[j._4_4_].za = (zip_t *)0x0;
    a[j._4_4_].name = (char *)0x0;
    a[j._4_4_].entry = (entry *)0x0;
    a[j._4_4_].comment = (char *)0x0;
    iVar1 = is_directory(zn[j._4_4_]);
    if (iVar1 == 0) {
      iVar1 = list_zip(zn[j._4_4_],(archive *)&a[(long)j._4_4_ + -1].comment_length);
      if (iVar1 < 0) {
        exit(2);
      }
    }
    else {
      iVar1 = list_directory(zn[j._4_4_],(archive *)&a[(long)j._4_4_ + -1].comment_length);
      if (iVar1 < 0) {
        exit(2);
      }
      paranoid = 0;
    }
    if (a[j._4_4_].za != (zip_t *)0x0) {
      qsort((void *)a[j._4_4_].nentry,(size_t)a[j._4_4_].za,0x38,entry_cmp);
    }
  }
  header_done = 0;
  n[1] = a[0].nentry;
  _res = a[0].za;
  n[0] = (zip_uint64_t)a[1].za;
  check = (_func_int_char_ptr_ptr_void_ptr_void_ptr *)0x0;
  if (paranoid != 0) {
    check = entry_paranoia_checks;
  }
  j._0_4_ = compare_list(zn,(void **)(n + 1),(zip_uint64_t *)&res,0x38,entry_cmp,check,entry_print);
  if ((paranoid != 0) &&
     (iVar1 = comment_compare((char *)a[0].entry,(size_t)a[0].comment,(char *)a[1].entry,
                              (size_t)a[1].comment), iVar1 != 0)) {
    if (verbose != 0) {
      printf("--- archive comment (%zu)\n",a[0].comment);
      printf("+++ archive comment (%zu)\n",a[1].comment);
    }
    j._0_4_ = 1;
  }
  for (j._4_4_ = 0; j._4_4_ < 2; j._4_4_ = j._4_4_ + 1) {
    if (a[j._4_4_].name != (char *)0x0) {
      zip_close(a[j._4_4_].name);
    }
    for (local_a8 = (zip_t *)0x0; local_a8 < a[j._4_4_].za; local_a8 = local_a8 + 1) {
      free(*(void **)(a[j._4_4_].nentry + (long)local_a8 * 0x38));
    }
    free((void *)a[j._4_4_].nentry);
  }
  if ((int)j == 0) {
    exit(0);
  }
  if ((int)j == 1) {
    exit(1);
  }
  exit(2);
}

Assistant:

static int
compare_zip(char *const zn[]) {
    struct archive a[2];
    struct entry *e[2];
    zip_uint64_t n[2];
    int i;
    int res;

    for (i = 0; i < 2; i++) {
	a[i].name = zn[i];
	a[i].entry = NULL;
	a[i].nentry = 0;
	a[i].za = NULL;
	a[i].comment = NULL;
	a[i].comment_length = 0;

	if (is_directory(zn[i])) {
#ifndef HAVE_FTS_H
	    fprintf(stderr, "%s: reading directories not supported\n", progname);
	    exit(2);
#else
	    if (list_directory(zn[i], a + i) < 0)
		exit(2);
	    paranoid = 0; /* paranoid checks make no sense for directories, since they compare zip metadata */
#endif
	}
	else {
	    if (list_zip(zn[i], a + i) < 0)
		exit(2);
	}
	if (a[i].nentry > 0)
	    qsort(a[i].entry, a[i].nentry, sizeof(a[i].entry[0]), entry_cmp);
    }

    header_done = 0;

    e[0] = a[0].entry;
    e[1] = a[1].entry;
    n[0] = a[0].nentry;
    n[1] = a[1].nentry;
    res = compare_list(zn, (const void **)e, n, sizeof(e[i][0]), entry_cmp, paranoid ? entry_paranoia_checks : NULL, entry_print);

    if (paranoid) {
	if (comment_compare(a[0].comment, a[0].comment_length, a[1].comment, a[1].comment_length) != 0) {
	    if (verbose) {
		printf("--- archive comment (%zu)\n", a[0].comment_length);
		printf("+++ archive comment (%zu)\n", a[1].comment_length);
	    }
	    res = 1;
	}
    }

    for (i = 0; i < 2; i++) {
	zip_uint64_t j;

	if (a[i].za) {
	    zip_close(a[i].za);
	}
	for (j = 0; j < a[i].nentry; j++) {
	    free(a[i].entry[j].name);
	}
	free(a[i].entry);
    }

    switch (res) {
    case 0:
	exit(0);

    case 1:
	exit(1);

    default:
	exit(2);
    }
}